

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

void http_parse_cookies(http_s *h,uint8_t is_url_encoded)

{
  size_t sVar1;
  uint64_t uVar2;
  FIOBJ FVar3;
  FIOBJ FVar4;
  FIOBJ FVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  size_t sVar9;
  size_t __n;
  char *pcVar10;
  bool bVar11;
  fio_str_info_s ret;
  fio_str_info_s local_68;
  FIOBJ local_50;
  code *local_48;
  http_s *local_40;
  code *local_38;
  
  if (h->headers != 0) {
    if ((h->cookies == 0) || (sVar1 = fiobj_hash_count(h->cookies), sVar1 == 0)) {
      if (http_parse_cookies::setcookie_header_hash == 0) {
        http_parse_cookies::setcookie_header_hash = fiobj_obj2hash(HTTP_HEADER_SET_COOKIE);
      }
      FVar3 = h->headers;
      uVar2 = fiobj_obj2hash(HTTP_HEADER_COOKIE);
      FVar3 = fiobj_hash_get2(FVar3,uVar2);
      local_40 = h;
      if (FVar3 != 0) {
        local_50 = FVar3;
        if (h->cookies == 0) {
          FVar3 = fiobj_hash_new();
          h->cookies = FVar3;
        }
        if (((~(uint)local_50 & 6) == 0 || (local_50 & 1) != 0) ||
           (*(char *)(local_50 & 0xfffffffffffffff8) != ')')) {
          if (((uint)local_50 & 7) == 2) {
            FVar3 = h->cookies;
            fio_str2str(&local_68,local_50);
            __n = local_68.len;
            pcVar8 = local_68.data;
            h = local_40;
            while (local_68.len = __n, local_68.data = pcVar8, local_40 = h, __n != 0) {
              if (*pcVar8 == ' ') {
                pcVar8 = pcVar8 + 1;
                __n = __n - 1;
              }
              else {
                pcVar6 = (char *)memchr(pcVar8,0x3d,__n);
                if (pcVar6 == (char *)0x0) {
                  pcVar6 = pcVar8;
                }
                pcVar7 = (char *)memchr(pcVar6,0x3b,(long)(pcVar8 + __n) - (long)pcVar6);
                pcVar10 = pcVar8 + __n;
                if (pcVar7 != (char *)0x0) {
                  pcVar10 = pcVar7;
                }
                http_add2hash(FVar3,pcVar8,(long)pcVar6 - (long)pcVar8,pcVar6 + 1,
                              (long)pcVar10 - (long)(pcVar6 + 1),is_url_encoded);
                pcVar8 = pcVar10 + 1;
                __n = local_68.len - ((long)pcVar8 - (long)local_68.data);
                h = local_40;
                if (local_68.len < (ulong)((long)pcVar8 - (long)local_68.data)) {
                  __n = 0;
                }
              }
            }
          }
        }
        else {
          local_48 = (code *)fiobj_ary_count(local_50);
          if (local_48 != (code *)0x0) {
            local_38 = fio_str2str;
            sVar1 = 0;
            do {
              FVar3 = h->cookies;
              FVar4 = fiobj_ary_index(local_50,sVar1);
              if (((uint)FVar4 & 7) == 2) {
                if (FVar4 == 0) {
                  local_68.data = anon_var_dwarf_20f;
                  local_68.capa = 0;
                  local_68.len = 4;
                }
                else {
                  (*local_38)(&local_68,FVar4);
                }
                while (pcVar8 = local_68.data, sVar9 = local_68.len, h = local_40, local_68.len != 0
                      ) {
                  if (*local_68.data == ' ') {
                    local_68.len = local_68.len - 1;
                    local_68.data = local_68.data + 1;
                  }
                  else {
                    pcVar6 = (char *)memchr(local_68.data,0x3d,local_68.len);
                    if (pcVar6 == (char *)0x0) {
                      pcVar6 = pcVar8;
                    }
                    pcVar7 = (char *)memchr(pcVar6,0x3b,(long)(pcVar8 + sVar9) - (long)pcVar6);
                    pcVar10 = pcVar8 + sVar9;
                    if (pcVar7 != (char *)0x0) {
                      pcVar10 = pcVar7;
                    }
                    http_add2hash(FVar3,pcVar8,(long)pcVar6 - (long)pcVar8,pcVar6 + 1,
                                  (long)pcVar10 - (long)(pcVar6 + 1),is_url_encoded);
                    pcVar10 = pcVar10 + 1;
                    bVar11 = local_68.len < (ulong)((long)pcVar10 - (long)local_68.data);
                    local_68.len = local_68.len - ((long)pcVar10 - (long)local_68.data);
                    local_68.data = pcVar10;
                    if (bVar11) {
                      local_68.len = 0;
                    }
                  }
                }
              }
              sVar1 = sVar1 + 1;
            } while ((code *)sVar1 != local_48);
          }
        }
      }
      FVar3 = h->headers;
      uVar2 = fiobj_obj2hash(HTTP_HEADER_SET_COOKIE);
      FVar3 = fiobj_hash_get2(FVar3,uVar2);
      if (FVar3 != 0) {
        if (h->cookies == 0) {
          FVar4 = fiobj_hash_new();
          h->cookies = FVar4;
        }
        if (((~(uint)FVar3 & 6) == 0 || (FVar3 & 1) != 0) ||
           (*(char *)(FVar3 & 0xfffffffffffffff8) != ')')) {
          if (((uint)FVar3 & 7) == 2) {
            FVar4 = h->cookies;
            fio_str2str(&local_68,FVar3);
            pcVar8 = local_68.data;
            sVar1 = local_68.len;
            pcVar6 = (char *)memchr(local_68.data,0x3d,local_68.len);
            if (pcVar6 == (char *)0x0) {
              pcVar6 = pcVar8;
            }
            pcVar7 = (char *)memchr(pcVar6,0x3b,(long)(pcVar8 + sVar1) - (long)pcVar6);
            pcVar10 = pcVar8 + sVar1;
            if (pcVar7 != (char *)0x0) {
              pcVar10 = pcVar7;
            }
            if (pcVar6 < pcVar10) {
              http_add2hash(FVar4,pcVar8,(long)pcVar6 - (long)pcVar8,pcVar6 + 1,
                            (long)pcVar10 - (long)(pcVar6 + 1),is_url_encoded);
            }
          }
        }
        else {
          sVar1 = fiobj_ary_count(FVar3);
          if (sVar1 != 0) {
            local_48 = fio_str2str;
            sVar9 = 0;
            local_50 = sVar1;
            do {
              FVar4 = h->cookies;
              FVar5 = fiobj_ary_index(FVar3,sVar9);
              if (((uint)FVar5 & 7) == 2) {
                if (FVar5 == 0) {
                  local_68.data = anon_var_dwarf_20f;
                  local_68.capa = 0;
                  local_68.len = 4;
                }
                else {
                  (*local_48)(&local_68,FVar5);
                }
                pcVar8 = local_68.data;
                sVar1 = local_68.len;
                pcVar6 = (char *)memchr(local_68.data,0x3d,local_68.len);
                if (pcVar6 == (char *)0x0) {
                  pcVar6 = pcVar8;
                }
                pcVar7 = (char *)memchr(pcVar6,0x3b,(long)(pcVar8 + sVar1) - (long)pcVar6);
                pcVar10 = pcVar8 + sVar1;
                if (pcVar7 != (char *)0x0) {
                  pcVar10 = pcVar7;
                }
                sVar1 = local_50;
                h = local_40;
                if (pcVar6 < pcVar10) {
                  http_add2hash(FVar4,pcVar8,(long)pcVar6 - (long)pcVar8,pcVar6 + 1,
                                (long)pcVar10 - (long)(pcVar6 + 1),is_url_encoded);
                  sVar1 = local_50;
                  h = local_40;
                }
              }
              sVar9 = sVar9 + 1;
            } while (sVar1 != sVar9);
          }
        }
      }
    }
    else if (2 < FIO_LOG_LEVEL) {
      FIO_LOG2STDERR("WARNING: (http) attempting to parse cookies more than once.");
      return;
    }
  }
  return;
}

Assistant:

void http_parse_cookies(http_s *h, uint8_t is_url_encoded) {
  if (!h->headers)
    return;
  if (h->cookies && fiobj_hash_count(h->cookies)) {
    FIO_LOG_WARNING("(http) attempting to parse cookies more than once.");
    return;
  }
  static uint64_t setcookie_header_hash;
  if (!setcookie_header_hash)
    setcookie_header_hash = fiobj_obj2hash(HTTP_HEADER_SET_COOKIE);
  FIOBJ c = fiobj_hash_get2(h->headers, fiobj_obj2hash(HTTP_HEADER_COOKIE));
  if (c) {
    if (!h->cookies)
      h->cookies = fiobj_hash_new();
    if (FIOBJ_TYPE_IS(c, FIOBJ_T_ARRAY)) {
      /* Array of Strings */
      size_t count = fiobj_ary_count(c);
      for (size_t i = 0; i < count; ++i) {
        http_parse_cookies_cookie_str(
            h->cookies, fiobj_ary_index(c, (int64_t)i), is_url_encoded);
      }
    } else {
      /* single string */
      http_parse_cookies_cookie_str(h->cookies, c, is_url_encoded);
    }
  }
  c = fiobj_hash_get2(h->headers, fiobj_obj2hash(HTTP_HEADER_SET_COOKIE));
  if (c) {
    if (!h->cookies)
      h->cookies = fiobj_hash_new();
    if (FIOBJ_TYPE_IS(c, FIOBJ_T_ARRAY)) {
      /* Array of Strings */
      size_t count = fiobj_ary_count(c);
      for (size_t i = 0; i < count; ++i) {
        http_parse_cookies_setcookie_str(
            h->cookies, fiobj_ary_index(c, (int64_t)i), is_url_encoded);
      }
    } else {
      /* single string */
      http_parse_cookies_setcookie_str(h->cookies, c, is_url_encoded);
    }
  }
}